

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O0

bool __thiscall Limonp::Config::loadFile(Config *this,char *filePath)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  istream *piVar4;
  size_type sVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *in_RSI;
  string *value;
  string *key;
  uint lineno;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vecBuf;
  string line;
  ifstream ifs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffbf8;
  reference in_stack_fffffffffffffc00;
  mapped_type *in_stack_fffffffffffffc08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3e0;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  uint uVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc40;
  char *local_3b0;
  bool local_382;
  char *local_368;
  allocator local_351;
  string local_350 [8];
  string *in_stack_fffffffffffffcb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  _Self local_330;
  _Self local_328;
  reference local_320;
  reference local_318;
  allocator local_309;
  string local_308 [32];
  string local_2e0 [4];
  allocator local_2b9;
  string local_2b8 [36];
  uint local_294;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  string local_278 [32];
  undefined4 local_258;
  allocator local_251;
  string local_250 [48];
  long local_220 [65];
  char *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::ifstream::ifstream(local_220,in_RSI,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_278);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x12fbd6);
    local_294 = 0;
    local_3e0 = in_stack_fffffffffffffc10;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_220,local_278);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      local_294 = local_294 + 1;
      trim((string *)0x12fc4d);
      bVar1 = std::__cxx11::string::empty();
      local_382 = true;
      if ((bVar1 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b8,"#",&local_2b9);
        local_382 = strStartsWith(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        std::__cxx11::string::~string(local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      }
      if (local_382 == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x12fdb9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e0,"=",(allocator *)&stack0xfffffffffffffd1f);
        bVar3 = splitStr(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                         in_stack_fffffffffffffcb8);
        bVar2 = true;
        if (bVar3) {
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_290);
          bVar2 = sVar5 != 2;
        }
        std::__cxx11::string::~string(local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd1f);
        if (bVar2) {
          pcVar6 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Limonp/Config.hpp"
                           ,0x2f);
          if (pcVar6 == (char *)0x0) {
            local_3b0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Limonp/Config.hpp"
            ;
          }
          else {
            local_3b0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Limonp/Config.hpp"
                                ,0x2f);
            local_3b0 = local_3b0 + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_308,"line[%d:%s] is illegal.",&local_309);
          uVar8 = local_294;
          uVar7 = std::__cxx11::string::c_str();
          Logger::LoggingF(4,local_3b0,0x2b,(string *)local_308,(ulong)uVar8,uVar7);
          std::__cxx11::string::~string(local_308);
          std::allocator<char>::~allocator((allocator<char> *)&local_309);
          local_1 = 0;
          goto LAB_00130214;
        }
        local_318 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_290,0);
        local_320 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_290,1);
        trim((string *)0x130026);
        trim((string *)0x130035);
        local_328._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(in_stack_fffffffffffffbf8);
        local_330._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(in_stack_fffffffffffffbf8,(key_type *)0x130061);
        bVar2 = std::operator!=(&local_328,&local_330);
        if (bVar2) {
          pcVar6 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Limonp/Config.hpp"
                           ,0x2f);
          if (pcVar6 == (char *)0x0) {
            local_3e0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x14f1ae;
          }
          else {
            local_3e0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Limonp/Config.hpp"
                                   ,0x2f);
            local_3e0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)local_3e0 + 1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_350,"key[%s] already exists.",&local_351);
          uVar7 = std::__cxx11::string::c_str();
          Logger::LoggingF(4,(char *)local_3e0,0x34,(string *)local_350,uVar7);
          std::__cxx11::string::~string(local_350);
          std::allocator<char>::~allocator((allocator<char> *)&local_351);
          local_1 = 0;
          goto LAB_00130214;
        }
        in_stack_fffffffffffffc00 = local_320;
        in_stack_fffffffffffffc08 =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffffc40,
                          (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38))
        ;
        std::__cxx11::string::operator=
                  ((string *)in_stack_fffffffffffffc08,(string *)in_stack_fffffffffffffc00);
      }
    }
    std::ifstream::close();
    local_1 = 1;
LAB_00130214:
    local_258 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_3e0);
    std::__cxx11::string::~string(local_278);
  }
  else {
    pcVar6 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Limonp/Config.hpp"
                     ,0x2f);
    if (pcVar6 == (char *)0x0) {
      local_368 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Limonp/Config.hpp"
      ;
    }
    else {
      local_368 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Limonp/Config.hpp"
                          ,0x2f);
      local_368 = local_368 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"open file[%s] failed.",&local_251);
    Logger::LoggingF(4,local_368,0x1a,(string *)local_250,local_18);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    local_1 = 0;
    local_258 = 1;
  }
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool loadFile(const char * const filePath)
            {
                ifstream ifs(filePath);
                if(!ifs)
                {
                    LogFatal("open file[%s] failed.", filePath);
                    return false;
                }
                string line;
                vector<string> vecBuf;
                uint lineno = 0;
                while(getline(ifs, line))
                {
                    lineno ++;
                    trim(line);
                    if(line.empty() || strStartsWith(line, "#"))
                    {
                        continue;
                    }
                    vecBuf.clear();
                    if(!splitStr(line, vecBuf, "=") || 2 != vecBuf.size())
                    {
                        LogFatal("line[%d:%s] is illegal.", lineno, line.c_str());
                        return false;
                    }
                    string& key = vecBuf[0];
                    string& value = vecBuf[1];
                    trim(key);
                    trim(value);
                    if(_map.end() != _map.find(key))
                    {
                        LogFatal("key[%s] already exists.", key.c_str());
                        return false;
                    }
                    _map[key] = value;
                }
                ifs.close();
                return true;
            }